

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v10::detail::default_arg_formatter<char>::operator()
          (default_arg_formatter<char> *this,handle h)

{
  format_args ctx_args;
  iterator iVar1;
  undefined1 local_70 [8];
  context format_ctx;
  undefined1 local_40 [8];
  basic_format_parse_context<char> parse_ctx;
  default_arg_formatter<char> *this_local;
  handle h_local;
  
  h_local.custom_.value = h.custom_.format;
  this_local = (default_arg_formatter<char> *)h.custom_.value;
  parse_ctx._16_8_ = this;
  basic_string_view<char>::basic_string_view((basic_string_view<char> *)&format_ctx.loc_);
  basic_format_parse_context<char>::basic_format_parse_context
            ((basic_format_parse_context<char> *)local_40,stack0xffffffffffffffb0,0);
  ctx_args.desc_ = (this->args).desc_;
  ctx_args.field_1 = (this->args).field_1;
  basic_format_context<fmt::v10::appender,_char>::basic_format_context
            ((basic_format_context<fmt::v10::appender,_char> *)local_70,
             (appender)
             (this->out).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
             ctx_args,(locale_ref)(this->loc).locale_);
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::handle::format
            ((handle *)&this_local,(parse_context_type *)local_40,
             (basic_format_context<fmt::v10::appender,_char> *)local_70);
  iVar1 = basic_format_context<fmt::v10::appender,_char>::out
                    ((basic_format_context<fmt::v10::appender,_char> *)local_70);
  return (iterator)
         iVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto operator()(typename basic_format_arg<context>::handle h) -> iterator {
    basic_format_parse_context<Char> parse_ctx({});
    context format_ctx(out, args, loc);
    h.format(parse_ctx, format_ctx);
    return format_ctx.out();
  }